

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O0

void __thiscall Am_Point_List::Am_Point_List(Am_Point_List *this,Am_Value *in_value)

{
  Am_ID_Tag AVar1;
  Am_Value *in_value_local;
  Am_Point_List *this_local;
  
  this->data = (Am_Point_List_Data *)in_value->value;
  this->item = (Am_Point_Item *)0x0;
  if (this->data != (Am_Point_List_Data *)0x0) {
    AVar1 = Am_Point_List_Data::Am_Point_List_Data_ID();
    if (AVar1 != in_value->type) {
      Am_Error("** Tried to set a Am_Point_List with a non Am_Point_List wrapper.");
    }
    Am_Wrapper::Note_Reference(&this->data->super_Am_Wrapper);
  }
  return;
}

Assistant:

Am_Point_List::Am_Point_List(const Am_Value &in_value)
{
  data = (Am_Point_List_Data *)in_value.value.wrapper_value;
  item = nullptr;
  if (data) {
    if (Am_Point_List_Data::Am_Point_List_Data_ID() != in_value.type)
      Am_Error("** Tried to set a Am_Point_List with a non "
               "Am_Point_List wrapper.");
    data->Note_Reference();
  }
}